

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

void __thiscall GlobOpt::RecordInlineeFrameInfo(GlobOpt *this,Instr *inlineeEnd)

{
  OpCode OVar1;
  InlineeFrameInfo *pIVar2;
  Opnd *this_00;
  code *pcVar3;
  GlobOpt *pGVar4;
  bool bVar5;
  BOOLEAN BVar6;
  ArgSlot AVar7;
  uint uVar8;
  uint functionId;
  undefined4 *puVar9;
  StackSym *pSVar10;
  SymOpnd *pSVar11;
  Value *pVVar12;
  StackSym *pSVar13;
  RegOpnd *pRVar14;
  GlobOptBlockData *this_01;
  Value *pVVar15;
  Instr *pIVar16;
  Instr *pIVar17;
  BailoutConstantValue BVar18;
  InlineFrameInfoValue local_60;
  GlobOpt *local_48;
  undefined4 *local_40;
  ArgSlot local_32;
  
  if (this->prePassLoop == (Loop *)0x0) {
    pIVar2 = inlineeEnd->m_func->frameInfo;
    if (pIVar2->isRecorded == true) {
      if ((pIVar2->function).type == InlineeFrameInfoValueType_None) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x322,"(frameInfo->function.type != InlineeFrameInfoValueType_None)",
                           "frameInfo->function.type != InlineeFrameInfoValueType_None");
        if (!bVar5) {
LAB_0045d935:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
      }
    }
    else {
      pSVar10 = IR::Opnd::GetStackSym(inlineeEnd->m_src2);
      pIVar16 = (pSVar10->field_5).m_instrDef;
      if ((pIVar16 != (Instr *)0x0 & pSVar10->field_0x18) == 1) {
        local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        local_48 = this;
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar5) goto LAB_0045d935;
        *puVar9 = 0;
        pIVar16 = (pSVar10->field_5).m_instrDef;
        local_48 = this;
        local_40 = puVar9;
      }
      do {
        if ((pIVar16->m_src2 == (Opnd *)0x0) ||
           (bVar5 = IR::Opnd::IsSymOpnd(pIVar16->m_src2), !bVar5)) {
LAB_0045d46b:
          pIVar17 = (Instr *)0x0;
        }
        else {
          pSVar11 = IR::Opnd::AsSymOpnd(pIVar16->m_src2);
          pSVar10 = Sym::AsStackSym(pSVar11->m_sym);
          bVar5 = StackSym::IsArgSlotSym(pSVar10);
          puVar9 = local_40;
          if (!bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar5) goto LAB_0045d935;
            *puVar9 = 0;
          }
          if (((((pSVar10->field_0x18 & 1) == 0) || ((pSVar10->field_5).m_instrDef == (Instr *)0x0))
              && (bVar5 = Func::IsInPhase(inlineeEnd->m_func,FGPeepsPhase), !bVar5)) &&
             (bVar5 = Func::IsInPhase(inlineeEnd->m_func,FGBuildPhase), !bVar5)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar5) goto LAB_0045d935;
            *puVar9 = 0;
          }
          if ((pSVar10->field_0x18 & 1) == 0) goto LAB_0045d46b;
          pIVar17 = (pSVar10->field_5).m_instrDef;
        }
        OVar1 = pIVar16->m_opcode;
        if (OVar1 != ArgOut_A_InlineSpecialized) {
          if (OVar1 == InlineeStart) {
            if ((pIVar2->function).type != InlineeFrameInfoValueType_None) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = local_40;
              *local_40 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x32a,
                                 "(frameInfo->function.type == InlineeFrameInfoValueType_None)",
                                 "frameInfo->function.type == InlineeFrameInfoValueType_None");
              if (!bVar5) goto LAB_0045d935;
              *puVar9 = 0;
            }
            pRVar14 = IR::Opnd::AsRegOpnd(pIVar16->m_src1);
            bVar5 = StackSym::IsConst(pRVar14->m_sym);
            if (bVar5) {
              BVar18 = StackSym::GetConstValueForBailout(pRVar14->m_sym);
              (pIVar2->function).type = InlineeFrameInfoValueType_Const;
              (pIVar2->function).field_1.constValue.type = BVar18.type;
              (pIVar2->function).field_1.constValue.u = BVar18.u;
            }
            else {
              pVVar12 = pIVar2->functionSymStartValue;
              if (pVVar12 == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = local_40;
                *local_40 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                   ,0x334,"(frameInfo->functionSymStartValue != nullptr)",
                                   "frameInfo->functionSymStartValue != nullptr");
                if (!bVar5) goto LAB_0045d935;
                *puVar9 = 0;
                pVVar12 = pIVar2->functionSymStartValue;
              }
              this_01 = CurrentBlockData(local_48);
              pVVar15 = GlobOptBlockData::FindValue(this_01,&pRVar14->m_sym->super_Sym);
              if (pVVar12->valueNumber != pVVar15->valueNumber) {
                Func::DisableCanDoInlineArgOpt(pIVar16->m_func);
                this = local_48;
                break;
              }
              pSVar10 = pRVar14->m_sym;
              (pIVar2->function).type = InlineeFrameInfoValueType_Sym;
              (pIVar2->function).field_1.sym = pSVar10;
              this = local_48;
            }
          }
          else {
            if (OVar1 == StartCall) {
              if (pIVar17 != (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar9 = local_40;
                *local_40 = 1;
                bVar5 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                   ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
                if (!bVar5) goto LAB_0045d935;
                *puVar9 = 0;
              }
              break;
            }
            if ((this->field_0xf7 & 2) != 0) goto LAB_0045d87f;
            pSVar11 = IR::Opnd::AsSymOpnd(pIVar16->m_dst);
            pSVar10 = Sym::AsStackSym(pSVar11->m_sym);
            AVar7 = StackSym::GetArgSlotNum(pSVar10);
            this_00 = pIVar16->m_src1;
            local_60.field_1.sym = (StackSym *)0x0;
            pSVar10 = IR::Opnd::GetStackSym(this_00);
            if (pSVar10 == (StackSym *)0x0) {
              BVar18 = IR::Opnd::GetConstValue(this_00);
LAB_0045d810:
              local_60.field_1.constValue.u = BVar18.u;
              local_60.type = InlineeFrameInfoValueType_Const;
              local_60.field_1.constValue.type = BVar18.type;
            }
            else {
              bVar5 = StackSym::IsConst(pSVar10);
              if ((bVar5) && (bVar5 = StackSym::IsInt64Const(pSVar10), !bVar5)) {
LAB_0045d808:
                BVar18 = StackSym::GetConstValueForBailout(pSVar10);
                goto LAB_0045d810;
              }
              pGVar4 = local_48;
              local_32 = AVar7;
              uVar8 = Func::GetSourceContextId(local_48->func);
              functionId = Func::GetLocalFunctionId(pGVar4->func);
              bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CopyPropPhase,uVar8,functionId);
              AVar7 = local_32;
              if ((((!bVar5) &&
                   ((pVVar12 = GlobOptBlockData::FindValue
                                         (&pGVar4->currentBlock->globOptData,&pSVar10->super_Sym),
                    AVar7 = local_32, pVVar12 != (Value *)0x0 &&
                    (pSVar13 = GlobOptBlockData::GetCopyPropSym
                                         (&pGVar4->currentBlock->globOptData,&pSVar10->super_Sym,
                                          pVVar12), AVar7 = local_32, pSVar13 != (StackSym *)0x0))))
                  && (pIVar2->varSyms->head != (Type_conflict)0x0)) &&
                 (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pIVar2->varSyms,(pSVar13->super_Sym).m_id), BVar6 != '\0')) {
                pSVar10 = pSVar13;
              }
              if ((pIVar2->intSyms->head == (Type_conflict)0x0) ||
                 (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pIVar2->intSyms,(pSVar10->super_Sym).m_id), BVar6 == '\0')) {
                if ((pIVar2->floatSyms->head == (Type_conflict)0x0) ||
                   (BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                      (pIVar2->floatSyms,(pSVar10->super_Sym).m_id), BVar6 == '\0'))
                {
                  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pIVar2->varSyms,(pSVar10->super_Sym).m_id);
                  if (BVar6 == '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar9 = local_40;
                    *local_40 = 1;
                    bVar5 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                       ,0x36b,"(frameInfo->varSyms->Test(argSym->m_id))",
                                       "frameInfo->varSyms->Test(argSym->m_id)");
                    if (bVar5) goto LAB_0045d7df;
                    goto LAB_0045d935;
                  }
                }
                else {
                  pSVar10 = StackSym::GetFloat64EquivSym(pSVar10,(Func *)0x0);
                  if (pSVar10 == (StackSym *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *local_40 = 1;
                    uVar8 = 0x367;
                    goto LAB_0045d7bd;
                  }
                }
              }
              else {
                pSVar10 = StackSym::GetInt32EquivSym(pSVar10,(Func *)0x0);
                if (pSVar10 == (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *local_40 = 1;
                  uVar8 = 0x361;
LAB_0045d7bd:
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                     ,uVar8,"(argSym)","argSym");
                  if (!bVar5) goto LAB_0045d935;
                  pSVar10 = (StackSym *)0x0;
                  puVar9 = local_40;
LAB_0045d7df:
                  *puVar9 = 0;
                }
              }
              bVar5 = StackSym::IsConst(pSVar10);
              if ((bVar5) && (bVar5 = StackSym::IsInt64Const(pSVar10), !bVar5)) goto LAB_0045d808;
              local_60.type = InlineeFrameInfoValueType_Sym;
              local_60.field_1.sym = pSVar10;
            }
            this = local_48;
            if (AVar7 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar9 = local_40;
              *local_40 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x377,"(argSlot >= 1)","argSlot >= 1");
              if (!bVar5) goto LAB_0045d935;
              *puVar9 = 0;
            }
            JsUtil::
            List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::SetItem(pIVar2->arguments,AVar7 - 1,&local_60);
          }
        }
LAB_0045d87f:
        pIVar16 = pIVar17;
      } while (pIVar17 != (Instr *)0x0);
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->alloc,pIVar2->intSyms);
      pIVar2->intSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->alloc,pIVar2->floatSyms);
      pIVar2->floatSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (this->alloc,pIVar2->varSyms);
      pIVar2->varSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
      pIVar2->isRecorded = true;
    }
  }
  return;
}

Assistant:

void GlobOpt::RecordInlineeFrameInfo(IR::Instr* inlineeEnd)
{
    if (this->IsLoopPrePass())
    {
        return;
    }
    InlineeFrameInfo* frameInfo = inlineeEnd->m_func->frameInfo;
    if (frameInfo->isRecorded)
    {
        Assert(frameInfo->function.type != InlineeFrameInfoValueType_None);
        // Due to Cmp peeps in flow graph - InlineeEnd can be cloned.
        return;
    }
    inlineeEnd->IterateArgInstrs([=] (IR::Instr* argInstr)
    {
        if (argInstr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(frameInfo->function.type == InlineeFrameInfoValueType_None);
            IR::RegOpnd* functionObject = argInstr->GetSrc1()->AsRegOpnd();
            if (functionObject->m_sym->IsConst())
            {
                frameInfo->function = InlineFrameInfoValue(functionObject->m_sym->GetConstValueForBailout());
            }
            else
            {
                // If the value of the functionObject symbol has changed between the inlineeStart and the inlineeEnd,
                // we don't record the inlinee frame info (see OS#18318884).
                Assert(frameInfo->functionSymStartValue != nullptr);
                if (!frameInfo->functionSymStartValue->IsEqualTo(CurrentBlockData()->FindValue(functionObject->m_sym)))
                {
                    argInstr->m_func->DisableCanDoInlineArgOpt();
                    return true;
                }

                frameInfo->function = InlineFrameInfoValue(functionObject->m_sym);
            }
        }
        else if(!GetIsAsmJSFunc()) // don't care about saving arg syms for wasm/asm.js
        {
            Js::ArgSlot argSlot = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
            IR::Opnd* argOpnd = argInstr->GetSrc1();
            InlineFrameInfoValue frameInfoValue;
            StackSym* argSym = argOpnd->GetStackSym();
            if (!argSym)
            {
                frameInfoValue = InlineFrameInfoValue(argOpnd->GetConstValue());
            }
            else if (argSym->IsConst() && !argSym->IsInt64Const())
            {
                // InlineFrameInfo doesn't currently support Int64Const
                frameInfoValue = InlineFrameInfoValue(argSym->GetConstValueForBailout());
            }
            else
            {
                if (!PHASE_OFF(Js::CopyPropPhase, func))
                {
                    Value* value = this->currentBlock->globOptData.FindValue(argSym);
                    if (value)
                    {
                        StackSym * copyPropSym = this->currentBlock->globOptData.GetCopyPropSym(argSym, value);
                        if (copyPropSym &&
                            frameInfo->varSyms->TestEmpty() && frameInfo->varSyms->Test(copyPropSym->m_id))
                        {
                            argSym = copyPropSym;
                        }
                    }
                }

                if (frameInfo->intSyms->TestEmpty() && frameInfo->intSyms->Test(argSym->m_id))
                {
                    // Var version of the sym is not live, use the int32 version
                    argSym = argSym->GetInt32EquivSym(nullptr);
                    Assert(argSym);
                }
                else if (frameInfo->floatSyms->TestEmpty() && frameInfo->floatSyms->Test(argSym->m_id))
                {
                    // Var/int32 version of the sym is not live, use the float64 version
                    argSym = argSym->GetFloat64EquivSym(nullptr);
                    Assert(argSym);
                }
                else
                {
                    Assert(frameInfo->varSyms->Test(argSym->m_id));
                }

                if (argSym->IsConst() && !argSym->IsInt64Const())
                {
                    frameInfoValue = InlineFrameInfoValue(argSym->GetConstValueForBailout());
                }
                else
                {
                    frameInfoValue = InlineFrameInfoValue(argSym);
                }
            }
            Assert(argSlot >= 1);
            frameInfo->arguments->SetItem(argSlot - 1, frameInfoValue);
        }
        return false;
    });

    JitAdelete(this->alloc, frameInfo->intSyms);
    frameInfo->intSyms = nullptr;
    JitAdelete(this->alloc, frameInfo->floatSyms);
    frameInfo->floatSyms = nullptr;
    JitAdelete(this->alloc, frameInfo->varSyms);
    frameInfo->varSyms = nullptr;
    frameInfo->isRecorded = true;
}